

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall cmMakefileTargetGenerator::WriteTargetBuildRules(cmMakefileTargetGenerator *this)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmGeneratorTarget *pcVar1;
  cmMakefile *pcVar2;
  pointer pbVar3;
  cmOSXBundleGenerator *pcVar4;
  MacOSXContentGeneratorType *pMVar5;
  cmTarget *this_01;
  cmLocalUnixMakefileGenerator3 *pcVar6;
  _Base_ptr p_Var7;
  cmSourceFile *pcVar8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile_00;
  undefined8 uVar9;
  bool bVar10;
  string *psVar11;
  cmValue cVar12;
  string *psVar13;
  _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
  *this_02;
  cmCustomCommand *cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar14;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar15;
  cmFileSet *this_03;
  mapped_type *pmVar16;
  _Rb_tree_node_base *p_Var17;
  iterator iVar18;
  pointer ppcVar19;
  string *output;
  pointer pbVar20;
  _Alloc_hider name;
  string *ispcObj;
  _Base_ptr __k;
  iterator __begin2;
  pointer cge;
  pointer ppcVar21;
  cmSourceFile *cc_00;
  pair<std::_Rb_tree_iterator<const_cmSourceFile_*>,_bool> pVar22;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  string_view str;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  undefined8 in_stack_fffffffffffffbf0;
  cmMakefileTargetGenerator *pcVar23;
  cmMakefileTargetGenerator *this_04;
  pointer puVar24;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  requiredLangs;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  cmSourceFile *sf;
  cmSourceFile *local_398;
  anon_class_8_1_8991fb9c evaluatedFiles;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> extraSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> headerSources;
  string local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ispcAdditionalObjs;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  file_set_map;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  _Any_data local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  _Any_data local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  string local_c0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  string local_50;
  
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)&file_set_map,this);
  cmGeneratorTarget::CheckCxxModuleStatus(pcVar1,(string *)&file_set_map);
  std::__cxx11::string::~string((string *)&file_set_map);
  bVar10 = cmGeneratorTarget::HaveCxx20ModuleSources
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  if (bVar10) {
    pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
    file_set_map._M_t._M_impl._0_8_ = 5;
    file_set_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_70955d;
    psVar11 = cmGeneratorTarget::GetName_abi_cxx11_
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (psVar11->_M_dataplus)._M_p;
    requiredLangs._M_t._M_impl._0_8_ = psVar11->_M_string_length;
    cmStrCat<char[78]>((string *)&sf,(cmAlphaNum *)&file_set_map,(cmAlphaNum *)&requiredLangs,
                       (char (*) [78])
                       "\" target contains C++ module sources which are not supported by the generator"
                      );
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&sf);
    std::__cxx11::string::~string((string *)&sf);
  }
  pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
  evaluatedFiles.this = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file_set_map,"ADDITIONAL_MAKE_CLEAN_FILES",(allocator<char> *)&requiredLangs
            );
  cVar12 = cmMakefile::GetProperty(pcVar2,(string *)&file_set_map);
  std::__cxx11::string::~string((string *)&file_set_map);
  if (cVar12.Value != (string *)0x0) {
    WriteTargetBuildRules::anon_class_8_1_8991fb9c::operator()
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&file_set_map,&evaluatedFiles,cVar12.Value);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->CleanFiles,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )file_set_map._M_t._M_impl._0_8_,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )file_set_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&file_set_map);
  }
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file_set_map,"ADDITIONAL_CLEAN_FILES",(allocator<char> *)&requiredLangs);
  cVar12 = cmGeneratorTarget::GetProperty(pcVar1,(string *)&file_set_map);
  std::__cxx11::string::~string((string *)&file_set_map);
  pcVar23 = this;
  if (cVar12.Value != (string *)0x0) {
    WriteTargetBuildRules::anon_class_8_1_8991fb9c::operator()
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&requiredLangs,&evaluatedFiles,cVar12.Value);
    pcVar23 = this;
    psVar13 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                        ((cmLocalGenerator *)this->LocalGenerator);
    uVar9 = requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
    for (psVar11 = (string *)requiredLangs._M_t._M_impl._0_8_; psVar11 != (string *)uVar9;
        psVar11 = psVar11 + 1) {
      cmsys::SystemTools::CollapseFullPath((string *)&file_set_map,psVar11,psVar13);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->CleanFiles,(string *)&file_set_map);
      std::__cxx11::string::~string((string *)&file_set_map);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&requiredLangs);
  }
  pcVar1 = (pcVar23->super_cmCommonTargetGenerator).GeneratorTarget;
  this_04 = pcVar23;
  GetConfigName_abi_cxx11_((string *)&file_set_map,pcVar23);
  cmGeneratorTarget::GetGeneratedISPCObjects(&ispcAdditionalObjs,pcVar1,(string *)&file_set_map);
  std::__cxx11::string::~string((string *)&file_set_map);
  this_00 = &pcVar23->CleanFiles;
  for (; ispcAdditionalObjs.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         ispcAdditionalObjs.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      ispcAdditionalObjs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           ispcAdditionalObjs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    cmOutputConverter::MaybeRelativeToCurBinDir
              ((string *)&file_set_map,
               &(this_04->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,
               ispcAdditionalObjs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this_00,(string *)&file_set_map);
    std::__cxx11::string::~string((string *)&file_set_map);
  }
  pcVar2 = (this_04->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file_set_map,"CLEAN_NO_CUSTOM",(allocator<char> *)&requiredLangs);
  cmMakefile::GetProperty(pcVar2,(string *)&file_set_map);
  bVar10 = cmIsOff((cmValue)0x35c8d8);
  std::__cxx11::string::~string((string *)&file_set_map);
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = (this_04->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)&file_set_map,this_04);
  cmGeneratorTarget::GetCustomCommands(pcVar1,&customCommands,(string *)&file_set_map);
  std::__cxx11::string::~string((string *)&file_set_map);
  ppcVar21 = customCommands.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  ppcVar19 = customCommands.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  do {
    if (ppcVar19 == ppcVar21) {
      if (bVar10) {
        pvVar15 = cmGeneratorTarget::GetPreBuildCommands
                            ((this_04->super_cmCommonTargetGenerator).GeneratorTarget);
        std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector
                  ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&sf,pvVar15);
        pvVar15 = cmGeneratorTarget::GetPreLinkCommands
                            ((this_04->super_cmCommonTargetGenerator).GeneratorTarget);
        ::cm::
        append<std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>,_0>
                  ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&sf,pvVar15);
        pvVar15 = cmGeneratorTarget::GetPostBuildCommands
                            ((this_04->super_cmCommonTargetGenerator).GeneratorTarget);
        ::cm::
        append<std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>,_0>
                  ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&sf,pvVar15);
        pcVar8 = local_398;
        for (cc_00 = sf; cc_00 != pcVar8;
            cc_00 = (cmSourceFile *)
                    &(cc_00->CompileOptions).
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          pcVar23 = this_04;
          GetConfigName_abi_cxx11_(&local_50,this_04);
          local_a0._M_engaged = false;
          local_108._M_unused._M_object = (void *)0x0;
          local_108._8_8_ = 0;
          local_f8 = 0;
          uStack_f0 = 0;
          computeInternalDepfile_00.super__Function_base._M_functor._8_8_ =
               in_stack_fffffffffffffbf0;
          computeInternalDepfile_00.super__Function_base._M_functor._M_unused._M_object = &local_108
          ;
          computeInternalDepfile_00.super__Function_base._M_manager = (_Manager_type)pcVar23;
          computeInternalDepfile_00._M_invoker = (_Invoker_type)cc_00;
          cmCustomCommandGenerator::cmCustomCommandGenerator
                    ((cmCustomCommandGenerator *)&file_set_map,(cmCustomCommand *)cc_00,&local_50,
                     (cmLocalGenerator *)this_04->LocalGenerator,true,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,computeInternalDepfile_00);
          std::_Function_base::~_Function_base((_Function_base *)&local_108);
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset(&local_a0);
          std::__cxx11::string::~string((string *)&local_50);
          pvVar14 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                              ((cmCustomCommandGenerator *)&file_set_map);
          pbVar3 = (pvVar14->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar20 = (pvVar14->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start; pbVar20 != pbVar3;
              pbVar20 = pbVar20 + 1) {
            cmOutputConverter::MaybeRelativeToCurBinDir
                      ((string *)&requiredLangs,
                       &(pcVar23->LocalGenerator->super_cmLocalCommonGenerator).
                        super_cmLocalGenerator.super_cmOutputConverter,pbVar20);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)this_00,(string *)&requiredLangs);
            std::__cxx11::string::~string((string *)&requiredLangs);
          }
          cmCustomCommandGenerator::~cmCustomCommandGenerator
                    ((cmCustomCommandGenerator *)&file_set_map);
          this_04 = pcVar23;
        }
        std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::~vector
                  ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&sf);
      }
      headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar1 = (this_04->super_cmCommonTargetGenerator).GeneratorTarget;
      GetConfigName_abi_cxx11_((string *)&file_set_map,this_04);
      cmGeneratorTarget::GetHeaderSources(pcVar1,&headerSources,(string *)&file_set_map);
      std::__cxx11::string::~string((string *)&file_set_map);
      pcVar4 = (this_04->OSXBundleGenerator)._M_t.
               super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
               .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
      pMVar5 = (this_04->MacOSXContentGenerator)._M_t.
               super___uniq_ptr_impl<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
               .
               super__Head_base<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_false>
               ._M_head_impl;
      GetConfigName_abi_cxx11_((string *)&file_set_map,this_04);
      cmOSXBundleGenerator::GenerateMacOSXContentStatements
                (pcVar4,&headerSources,&pMVar5->super_MacOSXContentGeneratorType,
                 (string *)&file_set_map);
      std::__cxx11::string::~string((string *)&file_set_map);
      extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar1 = (this_04->super_cmCommonTargetGenerator).GeneratorTarget;
      GetConfigName_abi_cxx11_((string *)&file_set_map,this_04);
      cmGeneratorTarget::GetExtraSources(pcVar1,&extraSources,(string *)&file_set_map);
      std::__cxx11::string::~string((string *)&file_set_map);
      pcVar4 = (this_04->OSXBundleGenerator)._M_t.
               super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
               .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
      pMVar5 = (this_04->MacOSXContentGenerator)._M_t.
               super___uniq_ptr_impl<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
               .
               super__Head_base<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_false>
               ._M_head_impl;
      GetConfigName_abi_cxx11_((string *)&file_set_map,this_04);
      cmOSXBundleGenerator::GenerateMacOSXContentStatements
                (pcVar4,&extraSources,&pMVar5->super_MacOSXContentGeneratorType,
                 (string *)&file_set_map);
      std::__cxx11::string::~string((string *)&file_set_map);
      pcVar2 = (this_04->super_cmCommonTargetGenerator).Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&file_set_map,"CMAKE_PCH_EXTENSION",(allocator<char> *)&requiredLangs);
      cVar12 = cmMakefile::GetDefinition(pcVar2,(string *)&file_set_map);
      std::__cxx11::string::~string((string *)&file_set_map);
      externalObjects.
      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      externalObjects.
      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      externalObjects.
      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar1 = (this_04->super_cmCommonTargetGenerator).GeneratorTarget;
      GetConfigName_abi_cxx11_((string *)&file_set_map,this_04);
      cmGeneratorTarget::GetExternalObjects(pcVar1,&externalObjects,(string *)&file_set_map);
      std::__cxx11::string::~string((string *)&file_set_map);
      ppcVar21 = externalObjects.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      pvVar14 = &this_04->ExternalObjects;
      for (ppcVar19 = externalObjects.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppcVar19 != ppcVar21;
          ppcVar19 = ppcVar19 + 1) {
        psVar11 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar19);
        str._M_str = (psVar11->_M_dataplus)._M_p;
        str._M_len = psVar11->_M_string_length;
        bVar10 = cmHasSuffix(str,cVar12);
        if (!bVar10) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(pvVar14,psVar11);
        }
      }
      file_set_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &file_set_map._M_t._M_impl.super__Rb_tree_header._M_header;
      file_set_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           file_set_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      file_set_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      file_set_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      this_01 = ((this_04->super_cmCommonTargetGenerator).GeneratorTarget)->Target;
      file_set_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           file_set_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      cmTarget::GetAllFileSetNames_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_2e8,this_01);
      for (name._M_p = local_2e8._M_dataplus._M_p; name._M_p != (pointer)local_2e8._M_string_length;
          name._M_p = name._M_p + 0x20) {
        this_03 = cmTarget::GetFileSet(this_01,(string *)name._M_p);
        if (this_03 == (cmFileSet *)0x0) {
          pcVar2 = (this_04->super_cmCommonTargetGenerator).Makefile;
          requiredLangs._M_t._M_impl._0_8_ = 8;
          requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (long)"\nTarget \"" + 1
          ;
          psVar11 = cmTarget::GetName_abi_cxx11_(this_01);
          local_398 = (cmSourceFile *)(psVar11->_M_dataplus)._M_p;
          sf = (cmSourceFile *)psVar11->_M_string_length;
          cmStrCat<char[32],std::__cxx11::string,char[25]>
                    ((string *)&fileEntries,(cmAlphaNum *)&requiredLangs,(cmAlphaNum *)&sf,
                     (char (*) [32])"\" is tracked to have file set \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name._M_p,
                     (char (*) [25])"\", but it was not found.");
          cmMakefile::IssueMessage(pcVar2,INTERNAL_ERROR,(string *)&fileEntries);
          std::__cxx11::string::~string((string *)&fileEntries);
        }
        else {
          cmFileSet::CompileFileEntries(&fileEntries,this_03);
          cmFileSet::CompileDirectoryEntries
                    ((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                      *)&objectSources,this_03);
          pcVar6 = this_04->LocalGenerator;
          pcVar23 = this_04;
          GetConfigName_abi_cxx11_((string *)&requiredLangs,this_04);
          cmFileSet::EvaluateDirectoryEntries
                    (&directories,this_03,
                     (vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                      *)&objectSources,(cmLocalGenerator *)pcVar6,(string *)&requiredLangs,
                     (this_04->super_cmCommonTargetGenerator).GeneratorTarget,
                     (cmGeneratorExpressionDAGChecker *)0x0);
          std::__cxx11::string::~string((string *)&requiredLangs);
          requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000
          ;
          requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header;
          requiredLangs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          this_04 = pcVar23;
          puVar24 = fileEntries.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          for (cge = fileEntries.
                     super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
              p_Var17 = requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
              cge != puVar24; cge = cge + 1) {
            pcVar6 = this_04->LocalGenerator;
            pcVar23 = this_04;
            GetConfigName_abi_cxx11_((string *)&sf,this_04);
            cmFileSet::EvaluateFileEntry
                      (this_03,&directories,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)&requiredLangs,cge,(cmLocalGenerator *)pcVar6,(string *)&sf,
                       (this_04->super_cmCommonTargetGenerator).GeneratorTarget,
                       (cmGeneratorExpressionDAGChecker *)0x0);
            std::__cxx11::string::~string((string *)&sf);
            this_04 = pcVar23;
          }
          for (; (_Rb_tree_header *)p_Var17 != &requiredLangs._M_t._M_impl.super__Rb_tree_header;
              p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17)) {
            p_Var7 = p_Var17[2]._M_parent;
            for (__k = *(_Base_ptr *)(p_Var17 + 2); __k != p_Var7; __k = __k + 1) {
              pmVar16 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&file_set_map,(key_type *)__k);
              std::__cxx11::string::_M_assign((string *)pmVar16);
            }
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)&requiredLangs);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&directories);
          std::
          vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
          ::~vector((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     *)&objectSources);
          std::
          vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
          ::~vector(&fileEntries);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_2e8);
      objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar1 = (this_04->super_cmCommonTargetGenerator).GeneratorTarget;
      GetConfigName_abi_cxx11_((string *)&requiredLangs,this_04);
      cmGeneratorTarget::GetObjectSources(pcVar1,&objectSources,(string *)&requiredLangs);
      std::__cxx11::string::~string((string *)&requiredLangs);
      requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header;
      requiredLangs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           requiredLangs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar10 = cmCommonTargetGenerator::HaveRequiredLanguages
                         (&this_04->super_cmCommonTargetGenerator,&objectSources,&requiredLangs);
      ppcVar21 = objectSources.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      ppcVar19 = objectSources.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (bVar10) {
        for (; ppcVar19 != ppcVar21; ppcVar19 = ppcVar19 + 1) {
          WriteObjectRuleFiles(this_04,*ppcVar19);
        }
      }
      ppcVar19 = objectSources.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar21 = objectSources.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppcVar21 != ppcVar19;
          ppcVar21 = ppcVar21 + 1) {
        pcVar8 = *ppcVar21;
        psVar11 = cmSourceFile::GetFullPath_abi_cxx11_(pcVar8);
        iVar18 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&file_set_map._M_t,psVar11);
        if (((_Rb_tree_header *)iVar18._M_node != &file_set_map._M_t._M_impl.super__Rb_tree_header)
           && ((__y._M_str = "CXX_MODULES", __y._M_len = 0xb,
               __x._M_str = *(char **)(iVar18._M_node + 2),
               __x._M_len = (size_t)iVar18._M_node[2]._M_parent, bVar10 = std::operator==(__x,__y),
               bVar10 || (__y_00._M_str = "CXX_MODULE_HEADER_UNITS", __y_00._M_len = 0x17,
                         __x_00._M_str = *(char **)(iVar18._M_node + 2),
                         __x_00._M_len = (size_t)iVar18._M_node[2]._M_parent,
                         bVar10 = std::operator==(__x_00,__y_00), bVar10)))) {
          cmSourceFile::GetLanguage_abi_cxx11_((string *)&sf,pcVar8);
          __y_01._M_str = "CXX";
          __y_01._M_len = 3;
          __x_01._M_str = (char *)sf;
          __x_01._M_len = (size_t)local_398;
          bVar10 = std::operator!=(__x_01,__y_01);
          std::__cxx11::string::~string((string *)&sf);
          if (bVar10) {
            pcVar2 = (this_04->super_cmCommonTargetGenerator).Makefile;
            sf = (cmSourceFile *)0x8;
            local_398 = (cmSourceFile *)0x59caf4;
            psVar13 = cmTarget::GetName_abi_cxx11_(this_01);
            fileEntries.
            super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar13->_M_dataplus)._M_p;
            fileEntries.
            super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar13->_M_string_length;
            cmStrCat<char[25],std::__cxx11::string,char[25],std::__cxx11::string,char[54]>
                      (&local_2e8,(cmAlphaNum *)&sf,(cmAlphaNum *)&fileEntries,
                       (char (*) [25])"\" contains the source\n  ",psVar11,
                       (char (*) [25])"\nin a file set of type \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (iVar18._M_node + 2),
                       (char (*) [54])"\" but the source is not classified as a \"CXX\" source.");
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_2e8);
            std::__cxx11::string::~string((string *)&local_2e8);
          }
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&requiredLangs._M_t);
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&objectSources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&file_set_map._M_t);
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&externalObjects.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&extraSources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&headerSources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&customCommands.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ispcAdditionalObjs);
      return;
    }
    sf = *ppcVar19;
    pcVar23 = this_04;
    if ((code)this_04->CMP0113New == (code)0x1) {
      this_02 = (_Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
                 *)cmLocalUnixMakefileGenerator3::GetCommandsVisited
                             (this_04->LocalGenerator,
                              (this_04->super_cmCommonTargetGenerator).GeneratorTarget);
      pVar22 = std::
               _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
               ::_M_insert_unique<cmSourceFile_const*const&>(this_02,&sf);
      pcVar23 = this_04;
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_0035c9a8;
    }
    else {
LAB_0035c9a8:
      cc = cmSourceFile::GetCustomCommand(sf);
      this_04 = pcVar23;
      GetConfigName_abi_cxx11_(&local_c0,pcVar23);
      local_78._M_engaged = false;
      local_e8._M_unused._M_object = (void *)0x0;
      local_e8._8_8_ = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      computeInternalDepfile.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffbf0;
      computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = &local_e8;
      computeInternalDepfile.super__Function_base._M_manager = (_Manager_type)this_04;
      computeInternalDepfile._M_invoker = (_Invoker_type)ppcVar19;
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)&file_set_map,cc,&local_c0,
                 (cmLocalGenerator *)pcVar23->LocalGenerator,true,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,computeInternalDepfile);
      std::_Function_base::~_Function_base((_Function_base *)&local_e8);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_78);
      std::__cxx11::string::~string((string *)&local_c0);
      GenerateCustomRuleFile(pcVar23,(cmCustomCommandGenerator *)&file_set_map);
      if (bVar10) {
        pvVar14 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                            ((cmCustomCommandGenerator *)&file_set_map);
        pbVar3 = (pvVar14->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar20 = (pvVar14->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar20 != pbVar3;
            pbVar20 = pbVar20 + 1) {
          cmOutputConverter::MaybeRelativeToCurBinDir
                    ((string *)&requiredLangs,
                     &(this_04->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator
                      .super_cmOutputConverter,pbVar20);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this_00,(string *)&requiredLangs);
          std::__cxx11::string::~string((string *)&requiredLangs);
        }
        pvVar14 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                            ((cmCustomCommandGenerator *)&file_set_map);
        pbVar3 = (pvVar14->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar20 = (pvVar14->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar20 != pbVar3;
            pbVar20 = pbVar20 + 1) {
          cmOutputConverter::MaybeRelativeToCurBinDir
                    ((string *)&requiredLangs,
                     &(this_04->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator
                      .super_cmOutputConverter,pbVar20);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this_00,(string *)&requiredLangs);
          std::__cxx11::string::~string((string *)&requiredLangs);
        }
      }
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)&file_set_map)
      ;
    }
    ppcVar19 = ppcVar19 + 1;
  } while( true );
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetBuildRules()
{
  this->GeneratorTarget->CheckCxxModuleStatus(this->GetConfigName());

  if (this->GeneratorTarget->HaveCxx20ModuleSources()) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("The \"", this->GeneratorTarget->GetName(),
               "\" target contains C++ module sources which are not supported "
               "by the generator"));
  }

  // -- Write the custom commands for this target

  // Evaluates generator expressions and expands prop_value
  auto evaluatedFiles =
    [this](const std::string& prop_value) -> std::vector<std::string> {
    std::vector<std::string> files;
    cmExpandList(cmGeneratorExpression::Evaluate(
                   prop_value, this->LocalGenerator, this->GetConfigName(),
                   this->GeneratorTarget),
                 files);
    return files;
  };

  // Look for additional files registered for cleaning in this directory.
  if (cmValue prop_value =
        this->Makefile->GetProperty("ADDITIONAL_MAKE_CLEAN_FILES")) {
    std::vector<std::string> const files = evaluatedFiles(*prop_value);
    this->CleanFiles.insert(files.begin(), files.end());
  }

  // Look for additional files registered for cleaning in this target.
  if (cmValue prop_value =
        this->GeneratorTarget->GetProperty("ADDITIONAL_CLEAN_FILES")) {
    std::vector<std::string> const files = evaluatedFiles(*prop_value);
    // For relative path support
    std::string const& binaryDir =
      this->LocalGenerator->GetCurrentBinaryDirectory();
    for (std::string const& cfl : files) {
      this->CleanFiles.insert(cmSystemTools::CollapseFullPath(cfl, binaryDir));
    }
  }

  // Look for ISPC extra object files generated by this target
  auto ispcAdditionalObjs =
    this->GeneratorTarget->GetGeneratedISPCObjects(this->GetConfigName());
  for (std::string const& ispcObj : ispcAdditionalObjs) {
    this->CleanFiles.insert(
      this->LocalGenerator->MaybeRelativeToCurBinDir(ispcObj));
  }

  // add custom commands to the clean rules?
  bool clean = cmIsOff(this->Makefile->GetProperty("CLEAN_NO_CUSTOM"));

  // First generate the object rule files.  Save a list of all object
  // files for this target.
  std::vector<cmSourceFile const*> customCommands;
  this->GeneratorTarget->GetCustomCommands(customCommands,
                                           this->GetConfigName());
  for (cmSourceFile const* sf : customCommands) {
    if (this->CMP0113New &&
        !this->LocalGenerator->GetCommandsVisited(this->GeneratorTarget)
           .insert(sf)
           .second) {
      continue;
    }
    cmCustomCommandGenerator ccg(*sf->GetCustomCommand(),
                                 this->GetConfigName(), this->LocalGenerator);
    this->GenerateCustomRuleFile(ccg);
    if (clean) {
      const std::vector<std::string>& outputs = ccg.GetOutputs();
      for (std::string const& output : outputs) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeRelativeToCurBinDir(output));
      }
      const std::vector<std::string>& byproducts = ccg.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeRelativeToCurBinDir(byproduct));
      }
    }
  }

  // Add byproducts from build events to the clean rules
  if (clean) {
    std::vector<cmCustomCommand> buildEventCommands =
      this->GeneratorTarget->GetPreBuildCommands();

    cm::append(buildEventCommands,
               this->GeneratorTarget->GetPreLinkCommands());
    cm::append(buildEventCommands,
               this->GeneratorTarget->GetPostBuildCommands());

    for (const auto& be : buildEventCommands) {
      cmCustomCommandGenerator beg(be, this->GetConfigName(),
                                   this->LocalGenerator);
      const std::vector<std::string>& byproducts = beg.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeRelativeToCurBinDir(byproduct));
      }
    }
  }
  std::vector<cmSourceFile const*> headerSources;
  this->GeneratorTarget->GetHeaderSources(headerSources,
                                          this->GetConfigName());
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    headerSources, this->MacOSXContentGenerator.get(), this->GetConfigName());
  std::vector<cmSourceFile const*> extraSources;
  this->GeneratorTarget->GetExtraSources(extraSources, this->GetConfigName());
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    extraSources, this->MacOSXContentGenerator.get(), this->GetConfigName());
  cmValue pchExtension = this->Makefile->GetDefinition("CMAKE_PCH_EXTENSION");
  std::vector<cmSourceFile const*> externalObjects;
  this->GeneratorTarget->GetExternalObjects(externalObjects,
                                            this->GetConfigName());
  for (cmSourceFile const* sf : externalObjects) {
    auto const& objectFileName = sf->GetFullPath();
    if (!cmHasSuffix(objectFileName, pchExtension)) {
      this->ExternalObjects.push_back(objectFileName);
    }
  }

  std::map<std::string, std::string> file_set_map;

  auto const* tgt = this->GeneratorTarget->Target;
  for (auto const& name : tgt->GetAllFileSetNames()) {
    auto const* file_set = tgt->GetFileSet(name);
    if (!file_set) {
      this->Makefile->IssueMessage(
        MessageType::INTERNAL_ERROR,
        cmStrCat("Target \"", tgt->GetName(),
                 "\" is tracked to have file set \"", name,
                 "\", but it was not found."));
      continue;
    }

    auto fileEntries = file_set->CompileFileEntries();
    auto directoryEntries = file_set->CompileDirectoryEntries();
    auto directories = file_set->EvaluateDirectoryEntries(
      directoryEntries, this->LocalGenerator, this->GetConfigName(),
      this->GeneratorTarget);

    std::map<std::string, std::vector<std::string>> files;
    for (auto const& entry : fileEntries) {
      file_set->EvaluateFileEntry(directories, files, entry,
                                  this->LocalGenerator, this->GetConfigName(),
                                  this->GeneratorTarget);
    }

    for (auto const& it : files) {
      for (auto const& filename : it.second) {
        file_set_map[filename] = file_set->GetType();
      }
    }
  }

  std::vector<cmSourceFile const*> objectSources;
  this->GeneratorTarget->GetObjectSources(objectSources,
                                          this->GetConfigName());

  // validate that all languages requested are enabled.
  std::set<std::string> requiredLangs;
  if (this->HaveRequiredLanguages(objectSources, requiredLangs)) {
    for (cmSourceFile const* sf : objectSources) {
      // Generate this object file's rule file.
      this->WriteObjectRuleFiles(*sf);
    }
  }

  for (cmSourceFile const* sf : objectSources) {
    auto const& path = sf->GetFullPath();
    auto const it = file_set_map.find(path);
    if (it != file_set_map.end()) {
      auto const& file_set_type = it->second;
      if (file_set_type == "CXX_MODULES"_s ||
          file_set_type == "CXX_MODULE_HEADER_UNITS"_s) {
        if (sf->GetLanguage() != "CXX"_s) {
          this->Makefile->IssueMessage(
            MessageType::FATAL_ERROR,
            cmStrCat(
              "Target \"", tgt->GetName(), "\" contains the source\n  ", path,
              "\nin a file set of type \"", file_set_type,
              R"(" but the source is not classified as a "CXX" source.)"));
        }
      }
    }
  }
}